

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformanceTesting.cpp
# Opt level: O2

void shortestPathPerfTest
               (Graph<std::pair<double,_double>_> *graph,function<Path_(int,_int)> *spAlgorithm,
               char test)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  iterator iter;
  int num_iter;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  map;
  size_type local_d8;
  double local_d0;
  int local_c8;
  int local_c4;
  Graph<std::pair<double,_double>_> *local_c0;
  function<Path_(int,_int)> *local_b8;
  undefined1 local_b0 [56];
  _Any_data local_78;
  code *local_68;
  code *local_60;
  Path local_50;
  
  local_c0 = graph;
  local_b8 = spAlgorithm;
  std::__cxx11::string::string((string *)local_b0,"Number of iterations: ",(allocator *)&local_d8);
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/../Graph/../Utils/Utils.h:20:90)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/../Graph/../Utils/Utils.h:20:90)>
             ::_M_manager;
  getOption(&local_c4,(string *)local_b0,(function<bool_(int)> *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  std::__cxx11::string::~string((string *)local_b0);
  lVar6 = 0;
  lVar5 = 0x7fffffffffffffff;
  lVar7 = 0;
  iVar1 = 0;
  while (iVar1 < local_c4) {
    local_c8 = iVar1;
    Graph<std::pair<double,_double>_>::getVertexMap
              ((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                *)local_b0,local_c0);
    local_d8 = local_b0._16_8_;
    iVar1 = rand();
    std::__advance<std::__detail::_Node_iterator<std::pair<int_const,int>,false,false>,long>
              (&local_d8,(ulong)(long)iVar1 % (ulong)local_b0._24_8_);
    local_d0 = (double)CONCAT44(local_d0._4_4_,*(undefined4 *)(local_d8 + 8));
    local_d8 = local_b0._16_8_;
    iVar1 = rand();
    std::__advance<std::__detail::_Node_iterator<std::pair<int_const,int>,false,false>,long>
              (&local_d8,(ulong)(long)iVar1 % (ulong)local_b0._24_8_);
    iVar1 = *(int *)(local_d8 + 8);
    lVar2 = std::chrono::_V2::system_clock::now();
    std::function<Path_(int,_int)>::operator()(&local_50,local_b8,local_d0._0_4_,iVar1);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&local_50.path.super__Vector_base<int,_std::allocator<int>_>);
    lVar3 = std::chrono::_V2::system_clock::now();
    lVar2 = (lVar3 - lVar2) / 1000;
    lVar7 = lVar7 + lVar2;
    if (lVar2 < lVar5) {
      lVar5 = lVar2;
    }
    if (lVar6 <= lVar2) {
      lVar6 = lVar2;
    }
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_b0);
    iVar1 = local_c8 + 1;
  }
  local_d0 = (double)lVar7 / (double)local_c4;
  poVar4 = std::operator<<((ostream *)&std::cout,"Minimum run time: ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"Maximum run time: ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::operator<<((ostream *)&std::cout,"Average run time: ");
  poVar4 = std::ostream::_M_insert<double>(local_d0);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"Total run time: ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::string((string *)local_b0,"ENTER to go back",(allocator *)&local_d8);
  enterWait((string *)local_b0);
  std::__cxx11::string::~string((string *)local_b0);
  return;
}

Assistant:

void shortestPathPerfTest(Graph<coordinates> &graph, const function<Path (int, int)> &spAlgorithm, char test) {
    int id_src, id_dest, num_iter;
    getOption(num_iter, "Number of iterations: ");

    long total = 0, min_d = LONG_MAX, max_d = 0;

    for (int i = 0; i < num_iter; i++) {
        auto map = graph.getVertexMap();
        auto iter = map.begin();
        advance(iter, rand() % map.size());
        id_src = iter->first;
        iter = map.begin();
        advance(iter, rand() % map.size());
        id_dest = iter->first;
        auto start = high_resolution_clock::now();
        spAlgorithm(id_src, id_dest);
        auto stop = high_resolution_clock::now();
        auto duration = duration_cast<microseconds>(stop - start);
        total += duration.count();
        min_d = min(min_d, (long) duration.count());
        max_d = max(max_d, (long) duration.count());
    }

    double average = (double) total / (double) num_iter;

    cout << "Minimum run time: " << min_d << endl;
    cout << "Maximum run time: " << max_d << endl;
    cout << "Average run time: " << average << endl;
    cout << "Total run time: " << total << endl;

    enterWait();
}